

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelMessageName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,Descriptor *descriptor)

{
  FileDescriptor *pFVar1;
  string *filename;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  Descriptor *local_20;
  Descriptor *descriptor_local;
  Generator *this_local;
  string *name;
  
  local_21 = 0;
  local_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".",&local_49);
  anon_unknown_0::NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (__return_storage_ptr__,descriptor,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pFVar1 = Descriptor::file(local_20);
  if (pFVar1 != this->file_) {
    pFVar1 = Descriptor::file(local_20);
    filename = FileDescriptor::name_abi_cxx11_(pFVar1);
    anon_unknown_0::ModuleAlias(&local_c0,filename);
    std::operator+(&local_a0,&local_c0,".");
    std::operator+(&local_80,&local_a0,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

string Generator::ModuleLevelMessageName(const Descriptor& descriptor) const {
  string name = NamePrefixedWithNestedTypes(descriptor, ".");
  if (descriptor.file() != file_) {
    name = ModuleAlias(descriptor.file()->name()) + "." + name;
  }
  return name;
}